

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_iarchive.h
# Opt level: O2

void __thiscall serialization::xml_iarchive::unserialize_start(xml_iarchive *this)

{
  xml_node<char> *node;
  
  std::
  stack<rapidxml::xml_node<char>const*,std::deque<rapidxml::xml_node<char>const*,std::allocator<rapidxml::xml_node<char>const*>>>
  ::
  stack<std::deque<rapidxml::xml_node<char>const*,std::allocator<rapidxml::xml_node<char>const*>>,void>
            ((stack<const_rapidxml::xml_node<char>_*,_std::deque<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>_>
              *)&node);
  std::deque<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>::
  _M_move_assign1(&(this->stack_).c,&node);
  std::
  _Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>::
  ~_Deque_base((_Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
                *)&node);
  node = rapidxml::xml_node<char>::first_node((xml_node<char> *)this,"serialization",0,true);
  if (node == (xml_node<char> *)0x0) {
    throw_serialization_error("serilization root","xml");
  }
  std::deque<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>::
  push_back(&(this->stack_).c,&node);
  return;
}

Assistant:

void unserialize_start() const
    {
        serialization_trace trace(__func__, "xml");
        stack_ = std::stack<const rapidxml::xml_node<> *> {};
        auto node = document_.first_node("serialization");
        if(node == nullptr)
            throw_serialization_error("serilization root", "xml");
        stack_.push(node);
    }